

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O2

void __thiscall
QPaintEngineEx::drawStaticTextItem(QPaintEngineEx *this,QStaticTextItem *staticTextItem)

{
  uint uVar1;
  long lVar2;
  QFontEngine *pQVar3;
  QPaintEngineState *pQVar4;
  bool bVar5;
  QVectorPath *pQVar6;
  QPaintEngineState *pQVar7;
  long in_FS_OFFSET;
  QBrush local_40;
  QPainterPath path;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath(&path);
  QPainterPath::setFillRule(&path,WindingFill);
  if (staticTextItem->numGlyphs != 0) {
    pQVar3 = (staticTextItem->m_fontEngine).d.ptr;
    (*pQVar3->_vptr_QFontEngine[0xf])
              (pQVar3,(staticTextItem->field_1).glyphs,(staticTextItem->field_0).glyphPositions,
               (ulong)(uint)staticTextItem->numGlyphs,&path,0);
    bVar5 = QPainterPath::isEmpty(&path);
    if (!bVar5) {
      pQVar4 = (this->super_QPaintEngine).state;
      pQVar7 = pQVar4 + -2;
      if (pQVar4 == (QPaintEngineState *)0x0) {
        pQVar7 = (QPaintEngineState *)0x0;
      }
      uVar1 = pQVar7[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
              super_QFlagsStorage<QPaintEngine::DirtyFlag>.i;
      if ((((uVar1 & 2) == 0) || ((uVar1 & 1) != 0)) ||
         ((*(ulong *)&(pQVar3->fontDef).field_0x60 & 0x100) != 0)) {
        pQVar6 = QPainterPathPrivate::vectorPath((QPainterPathPrivate *)path.d_ptr.d.ptr);
        QPen::brush((QPen *)&local_40);
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,pQVar6,&local_40);
        QBrush::~QBrush(&local_40);
      }
      else {
        pQVar7[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = uVar1 | 1;
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x26])(this);
        pQVar6 = QPainterPathPrivate::vectorPath((QPainterPathPrivate *)path.d_ptr.d.ptr);
        QPen::brush((QPen *)&local_40);
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,pQVar6,&local_40);
        QBrush::~QBrush(&local_40);
        pQVar7[0x1b].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = uVar1;
        (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x26])(this);
      }
    }
  }
  QPainterPath::~QPainterPath(&path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngineEx::drawStaticTextItem(QStaticTextItem *staticTextItem)
{
    QPainterPath path;
    path.setFillRule(Qt::WindingFill);

    if (staticTextItem->numGlyphs == 0)
        return;

    QFontEngine *fontEngine = staticTextItem->fontEngine();
    fontEngine->addGlyphsToPath(staticTextItem->glyphs, staticTextItem->glyphPositions,
                                staticTextItem->numGlyphs, &path, { });
    if (!path.isEmpty()) {
        QPainterState *s = state();
        QPainter::RenderHints oldHints = s->renderHints;
        bool changedHints = false;
        if (bool(oldHints & QPainter::TextAntialiasing)
            && !bool(fontEngine->fontDef.styleStrategy & QFont::NoAntialias)
            && !bool(oldHints & QPainter::Antialiasing)) {
            s->renderHints |= QPainter::Antialiasing;
            renderHintsChanged();
            changedHints = true;
        }

        fill(qtVectorPathForPath(path), s->pen.brush());

        if (changedHints) {
            s->renderHints = oldHints;
            renderHintsChanged();
        }
    }
}